

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_core_linux.c
# Opt level: O2

int os_core_linux_get_random(void *dst,size_t length)

{
  int __fd;
  ssize_t sVar1;
  int iVar2;
  
  __fd = open("/dev/urandom",0);
  if (__fd == -1) {
    iVar2 = -1;
  }
  else {
    iVar2 = -1;
    for (; length != 0; length = length - sVar1) {
      sVar1 = read(__fd,dst,length);
      if (sVar1 < 0) goto LAB_0014b499;
      dst = (void *)((long)dst + sVar1);
    }
    iVar2 = 0;
LAB_0014b499:
    close(__fd);
  }
  return iVar2;
}

Assistant:

int
os_core_linux_get_random(void *dst, size_t length) {
  int random_fd;
  ssize_t result;
  uint8_t *u8ptr;

  u8ptr = dst;

  /* open urandom */
  random_fd = open("/dev/urandom", O_RDONLY);
  if (random_fd == -1) {
    return -1;
  }

  while (length > 0) {
    result = read(random_fd, u8ptr, length);
    if (result < 0) {
      close(random_fd);
      return -1;
    }

    u8ptr += result;
    length -= result;
  }
  close(random_fd);
  return 0;
}